

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

void __thiscall basisu::basis_compressor::basis_compressor(basis_compressor *this)

{
  basis_compressor_params::basis_compressor_params(&this->m_params);
  (this->m_frontend).m_params.m_num_source_blocks = 0;
  (this->m_frontend).m_params.m_pSource_blocks = (pixel_block *)0x0;
  this->m_pOpenCL_context = (opencl_context_ptr)0x0;
  (this->m_slice_images).m_p = (image *)0x0;
  (this->m_slice_images).m_size = 0;
  (this->m_slice_images).m_capacity = 0;
  (this->m_stats).m_p = (image_stats *)0x0;
  *(undefined8 *)((long)&(this->m_stats).m_p + 4) = 0;
  *(undefined8 *)&(this->m_stats).m_capacity = 0;
  this->m_basis_bits_per_texel = 0.0;
  (this->m_slice_descs).m_p = (basisu_backend_slice_desc *)0x0;
  *(undefined8 *)((long)&(this->m_slice_descs).m_p + 4) = 0;
  *(undefined8 *)&(this->m_slice_descs).m_capacity = 0;
  (this->m_frontend).m_params.m_max_endpoint_clusters = 0x100;
  (this->m_frontend).m_params.m_max_selector_clusters = 0x100;
  (this->m_frontend).m_params.m_compression_level = 2;
  (this->m_frontend).m_params.m_perceptual = true;
  (this->m_frontend).m_params.m_debug_stats = false;
  (this->m_frontend).m_params.m_debug_images = false;
  (this->m_frontend).m_params.m_dump_endpoint_clusterization = true;
  (this->m_frontend).m_params.m_validate = false;
  (this->m_frontend).m_params.m_multithreaded = false;
  (this->m_frontend).m_params.m_disable_hierarchical_endpoint_codebooks = false;
  (this->m_frontend).m_params.m_tex_type = cBASISTexType2D;
  (this->m_frontend).m_num_endpoint_codebook_iterations = 0;
  (this->m_frontend).m_num_selector_codebook_iterations = 0;
  (this->m_frontend).m_params.m_pOpenCL_context = (opencl_context_ptr)0x0;
  (this->m_frontend).m_params.m_pJob_pool = (job_pool *)0x0;
  *(undefined8 *)((long)&(this->m_frontend).m_params.m_pJob_pool + 3) = 0;
  *(undefined8 *)((long)&(this->m_frontend).m_total_blocks + 3) = 0;
  (this->m_frontend).m_source_blocks.m_p = (pixel_block *)0x0;
  (this->m_frontend).m_source_blocks.m_size = 0;
  (this->m_frontend).m_source_blocks.m_capacity = 0;
  (this->m_frontend).m_encoded_blocks.m_p = (etc_block *)0x0;
  (this->m_frontend).m_encoded_blocks.m_size = 0;
  (this->m_frontend).m_encoded_blocks.m_capacity = 0;
  (this->m_frontend).m_orig_encoded_blocks.m_p = (etc_block *)0x0;
  (this->m_frontend).m_orig_encoded_blocks.m_size = 0;
  (this->m_frontend).m_orig_encoded_blocks.m_capacity = 0;
  (this->m_frontend).m_etc1_blocks_etc1s.m_p = (etc_block *)0x0;
  (this->m_frontend).m_etc1_blocks_etc1s.m_size = 0;
  (this->m_frontend).m_etc1_blocks_etc1s.m_capacity = 0;
  (this->m_frontend).m_endpoint_clusterizer.m_nodes.m_p = (tsvq_node *)0x0;
  (this->m_frontend).m_endpoint_clusterizer.m_nodes.m_size = 0;
  (this->m_frontend).m_endpoint_clusterizer.m_nodes.m_capacity = 0;
  (this->m_frontend).m_endpoint_clusterizer.m_training_vecs.m_p =
       (pair<basisu::vec<6U,_float>,_unsigned_long> *)0x0;
  (this->m_frontend).m_endpoint_clusterizer.m_training_vecs.m_size = 0;
  (this->m_frontend).m_endpoint_clusterizer.m_training_vecs.m_capacity = 0;
  (this->m_frontend).m_endpoint_clusterizer.m_next_codebook_index = 0;
  memset(&(this->m_frontend).m_endpoint_clusters,0,0xf9);
  (this->m_source_blocks).m_p = (pixel_block *)0x0;
  (this->m_source_blocks).m_size = 0;
  (this->m_source_blocks).m_capacity = 0;
  (this->m_frontend_output_textures).m_p = (gpu_image *)0x0;
  (this->m_frontend_output_textures).m_size = 0;
  (this->m_frontend_output_textures).m_capacity = 0;
  (this->m_best_etc1s_images).m_p = (gpu_image *)0x0;
  (this->m_best_etc1s_images).m_size = 0;
  (this->m_best_etc1s_images).m_capacity = 0;
  (this->m_best_etc1s_images_unpacked).m_p = (image *)0x0;
  (this->m_best_etc1s_images_unpacked).m_size = 0;
  (this->m_best_etc1s_images_unpacked).m_capacity = 0;
  basisu_backend::basisu_backend(&this->m_backend);
  (this->m_basis_file).m_comp_data.m_p = (uchar *)0x0;
  (this->m_basis_file).m_comp_data.m_size = 0;
  (this->m_basis_file).m_comp_data.m_capacity = 0;
  (this->m_basis_file).m_images_descs.m_p = (basis_slice_desc *)0x0;
  (this->m_basis_file).m_images_descs.m_size = 0;
  (this->m_basis_file).m_images_descs.m_capacity = 0;
  (this->m_decoded_output_textures).m_p = (gpu_image *)0x0;
  (this->m_decoded_output_textures).m_size = 0;
  (this->m_decoded_output_textures).m_capacity = 0;
  (this->m_decoded_output_textures_unpacked).m_p = (image *)0x0;
  (this->m_decoded_output_textures_unpacked).m_size = 0;
  (this->m_decoded_output_textures_unpacked).m_capacity = 0;
  (this->m_decoded_output_textures_bc7).m_p = (gpu_image *)0x0;
  (this->m_decoded_output_textures_bc7).m_size = 0;
  (this->m_decoded_output_textures_bc7).m_capacity = 0;
  (this->m_decoded_output_textures_unpacked_bc7).m_p = (image *)0x0;
  (this->m_decoded_output_textures_unpacked_bc7).m_size = 0;
  (this->m_decoded_output_textures_unpacked_bc7).m_capacity = 0;
  (this->m_output_basis_file).m_p = (uchar *)0x0;
  (this->m_output_basis_file).m_size = 0;
  (this->m_output_basis_file).m_capacity = 0;
  (this->m_output_ktx2_file).m_p = (uchar *)0x0;
  (this->m_output_ktx2_file).m_size = 0;
  (this->m_output_ktx2_file).m_capacity = 0;
  (this->m_uastc_slice_textures).m_p = (gpu_image *)0x0;
  (this->m_uastc_slice_textures).m_size = 0;
  (this->m_uastc_slice_textures).m_capacity = 0;
  basisu_backend_output::basisu_backend_output(&this->m_uastc_backend_output);
  this->m_any_source_image_has_alpha = false;
  this->m_opencl_failed = false;
  debug_printf("basis_compressor::basis_compressor\n");
  if (g_library_initialized != '\0') {
    return;
  }
  __assert_fail("g_library_initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                ,0x3b,"basisu::basis_compressor::basis_compressor()");
}

Assistant:

basis_compressor::basis_compressor() :
	   m_pOpenCL_context(nullptr),
		m_basis_file_size(0),
		m_basis_bits_per_texel(0.0f),
		m_total_blocks(0),
		m_any_source_image_has_alpha(false),
	   m_opencl_failed(false)
	{
		debug_printf("basis_compressor::basis_compressor\n");
		
		assert(g_library_initialized);
	}